

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectedGraph.h
# Opt level: O0

bool __thiscall
netlist::DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge>::getInEdgesToNode
          (DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge> *this,NetlistNode *targetNode,
          vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> *results)

{
  bool bVar1;
  byte bVar2;
  vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> *in_RDX;
  long in_RDI;
  unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *node;
  const_iterator __end0;
  const_iterator __begin0;
  NodeListType *__range2;
  vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> tempResults;
  vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> *in_stack_ffffffffffffff48
  ;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> *in_stack_ffffffffffffff60
  ;
  iterator in_stack_ffffffffffffff80;
  iterator in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff90;
  __normal_iterator<netlist::NetlistEdge_**,_std::vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<netlist::NetlistEdge_**,_std::vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>_>
  in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffa8;
  __normal_iterator<const_std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_*,_std::vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>_>
  local_40;
  long local_38;
  vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> *local_18;
  
  local_18 = in_RDX;
  std::vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>::vector
            ((vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> *)0x1f5aab);
  local_38 = in_RDI + 8;
  local_40._M_current =
       (unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *)
       std::
       vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
       ::begin((vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
                *)in_stack_ffffffffffffff48);
  std::
  vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
  ::end((vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
         *)in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_*,_std::vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>_>
                      ((__normal_iterator<const_std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_*,_std::vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       (__normal_iterator<const_std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_*,_std::vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_*,_std::vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>_>
    ::operator*(&local_40);
    std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>::operator->
              ((unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *)
               0x1f5b13);
    Node<netlist::NetlistNode,_netlist::NetlistEdge>::getEdgesTo
              ((Node<netlist::NetlistNode,_netlist::NetlistEdge> *)
               in_stack_ffffffffffffff90._M_current,
               (NetlistNode *)in_stack_ffffffffffffff88._M_current,
               (vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> *)
               in_stack_ffffffffffffff80._M_current);
    in_stack_ffffffffffffff60 = local_18;
    in_stack_ffffffffffffff90 =
         std::vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>::end
                   (in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<netlist::NetlistEdge*const*,std::vector<netlist::NetlistEdge*,std::allocator<netlist::NetlistEdge*>>>
    ::__normal_iterator<netlist::NetlistEdge**>
              ((__normal_iterator<netlist::NetlistEdge_*const_*,_std::vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>_>
                *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               (__normal_iterator<netlist::NetlistEdge_**,_std::vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>_>
                *)in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff88 =
         std::vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>::begin
                   (in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff80 =
         std::vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>::end
                   (in_stack_ffffffffffffff48);
    std::vector<netlist::NetlistEdge*,std::allocator<netlist::NetlistEdge*>>::
    insert<__gnu_cxx::__normal_iterator<netlist::NetlistEdge**,std::vector<netlist::NetlistEdge*,std::allocator<netlist::NetlistEdge*>>>,void>
              ((vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> *)
               in_stack_ffffffffffffff90._M_current,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>::clear
              ((vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_> *)0x1f5bb0);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_*,_std::vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>_>
    ::operator++(&local_40);
  }
  bVar1 = std::vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>::empty
                    (in_stack_ffffffffffffff60);
  bVar2 = bVar1 ^ 0xff;
  std::vector<netlist::NetlistEdge_*,_std::allocator<netlist::NetlistEdge_*>_>::~vector
            (in_stack_ffffffffffffff60);
  return (bool)(bVar2 & 1);
}

Assistant:

bool getInEdgesToNode(const NodeType& targetNode, std::vector<EdgeType*>& results) const {
        SLANG_ASSERT(results.empty() && "Expected the results parameter to be empty");
        std::vector<EdgeType*> tempResults;
        for (auto& node : nodes) {
            node->getEdgesTo(targetNode, tempResults);
            results.insert(results.end(), tempResults.begin(), tempResults.end());
            tempResults.clear();
        }
        return !results.empty();
    }